

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

shared_ptr<duckdb::PreparedStatementData,_true> __thiscall
duckdb::ClientContext::CreatePreparedStatement
          (ClientContext *this,ClientContextLock *lock,string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          values,PreparedStatementMode mode)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  byte bVar2;
  int iVar3;
  pointer pRVar4;
  ClientContextState *pCVar5;
  pointer pSVar6;
  type pPVar7;
  string *extraout_RDX;
  string *query_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  string *extraout_RDX_03;
  string *query_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  byte bVar9;
  shared_ptr<duckdb::ClientContextState,_true> *state_2;
  shared_ptr<duckdb::ClientContextState,_true> *state_1;
  element_type *peVar10;
  undefined7 in_register_00000089;
  bool bVar11;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  shared_ptr<duckdb::PreparedStatementData,_true> sVar12;
  undefined1 in_stack_00000008;
  ErrorData error;
  long *local_f0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
  *local_e8;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *local_e0;
  __buckets_ptr local_d8;
  undefined8 local_d0;
  element_type *local_b0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  
  local_e8 = values.ptr;
  local_e0 = statement;
  pRVar4 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
           ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                         *)(lock + 5));
  RegisteredStateManager::States
            ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)
             &stack0xffffffffffffff50,pRVar4);
  _Var1._M_pi = local_a8._M_pi;
  bVar9 = 0;
  for (peVar10 = local_b0; peVar10 != (element_type *)_Var1._M_pi;
      peVar10 = (element_type *)&peVar10->db) {
    pCVar5 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                       ((shared_ptr<duckdb::ClientContextState,_true> *)peVar10);
    bVar2 = (**(code **)(*(long *)pCVar5 + 0x50))(pCVar5);
    bVar9 = bVar9 | bVar2;
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
  ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
             *)&stack0xffffffffffffff50);
  query_01 = extraout_RDX;
  if ((bVar9 & 1) != 0) {
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d0 = CONCAT71(in_register_00000089,mode);
    pSVar6 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)local_e8);
    (*pSVar6->_vptr_SQLStatement[3])(&local_f0,pSVar6);
    CreatePreparedStatementInternal
              ((ClientContext *)&stack0xffffffffffffff50,lock,query_00,local_e0,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                *)&local_f0);
    shared_ptr<duckdb::PreparedStatementData,_true>::operator=
              ((shared_ptr<duckdb::PreparedStatementData,_true> *)this,
               (shared_ptr<duckdb::PreparedStatementData,_true> *)&stack0xffffffffffffff50);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff58);
    _Var8._M_pi = extraout_RDX_00;
    if (local_f0 != (long *)0x0) {
      (**(code **)(*local_f0 + 8))();
      _Var8._M_pi = extraout_RDX_01;
    }
    local_f0 = (long *)0x0;
    bVar11 = false;
    if ((this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pRVar4 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
               ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                             *)(lock + 5));
      RegisteredStateManager::States
                ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)
                 &stack0xffffffffffffff50,pRVar4);
      for (peVar10 = local_b0; peVar10 != (element_type *)local_a8._M_pi;
          peVar10 = (element_type *)&peVar10->db) {
        pCVar5 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                           ((shared_ptr<duckdb::ClientContextState,_true> *)peVar10);
        pPVar7 = shared_ptr<duckdb::PreparedStatementData,_true>::operator*
                           ((shared_ptr<duckdb::PreparedStatementData,_true> *)this);
        iVar3 = (**(code **)(*(long *)pCVar5 + 0x60))(pCVar5,lock,pPVar7,in_stack_00000008);
        if (iVar3 == 1) {
          bVar11 = true;
        }
      }
      ::std::
      vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
      ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                 *)&stack0xffffffffffffff50);
      _Var8._M_pi = extraout_RDX_02;
    }
    if (!bVar11) goto LAB_019bb8f8;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    query_01 = extraout_RDX_03;
  }
  local_d8 = (local_e8->_M_h)._M_buckets;
  (local_e8->_M_h)._M_buckets = (__buckets_ptr)0x0;
  sVar12 = CreatePreparedStatementInternal
                     (this,lock,query_01,local_e0,
                      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                       *)&local_d8);
  _Var8._M_pi = sVar12.internal.
                super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_d8 != (__buckets_ptr)0x0) {
    (*(code *)(*local_d8)[1]._M_nxt)();
    _Var8._M_pi = extraout_RDX_04;
  }
LAB_019bb8f8:
  sVar12.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  sVar12.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<duckdb::PreparedStatementData,_true>)
         sVar12.internal.
         super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<PreparedStatementData>
ClientContext::CreatePreparedStatement(ClientContextLock &lock, const string &query, unique_ptr<SQLStatement> statement,
                                       optional_ptr<case_insensitive_map_t<BoundParameterData>> values,
                                       PreparedStatementMode mode) {
	// check if any client context state could request a rebind
	bool can_request_rebind = false;
	for (auto &state : registered_state->States()) {
		if (state->CanRequestRebind()) {
			can_request_rebind = true;
		}
	}
	if (can_request_rebind) {
		bool rebind = false;
		// if any registered state can request a rebind we do the binding on a copy first
		shared_ptr<PreparedStatementData> result;
		try {
			result = CreatePreparedStatementInternal(lock, query, statement->Copy(), values);
		} catch (std::exception &ex) {
			ErrorData error(ex);
			// check if any registered client context state wants to try a rebind
			for (auto &state : registered_state->States()) {
				auto info = state->OnPlanningError(*this, *statement, error);
				if (info == RebindQueryInfo::ATTEMPT_TO_REBIND) {
					rebind = true;
				}
			}
			if (!rebind) {
				throw;
			}
		}
		if (result) {
			D_ASSERT(!rebind);
			for (auto &state : registered_state->States()) {
				auto info = state->OnFinalizePrepare(*this, *result, mode);
				if (info == RebindQueryInfo::ATTEMPT_TO_REBIND) {
					rebind = true;
				}
			}
		}
		if (!rebind) {
			return result;
		}
		// an extension wants to do a rebind - do it once
	}

	return CreatePreparedStatementInternal(lock, query, std::move(statement), values);
}